

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O2

void __thiscall elf_parser::Elf_parser::load_memory_map(Elf_parser *this)

{
  int __fd;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint8_t *puVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  stat st;
  
  __fd = open((this->m_program_path)._M_dataplus._M_p,2);
  if (__fd < 0) {
    std::operator+(&local_f0,&this->_last_error,"open failed: ");
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    std::operator+(&local_d0,&local_f0,pcVar3);
    std::__cxx11::string::operator=((string *)&this->_last_error,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    bVar5 = true;
  }
  else {
    iVar1 = fstat(__fd,(stat *)&st);
    if (iVar1 < 0) {
      std::operator+(&local_f0,&this->_last_error,"stat failed: ");
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      std::operator+(&local_d0,&local_f0,pcVar3);
      std::__cxx11::string::operator=((string *)&this->_last_error,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      this->_failed = true;
    }
    bVar5 = false;
    puVar4 = (uint8_t *)mmap((void *)0x0,st.st_size,3,2,__fd,0);
    this->m_mmap_program = puVar4;
    if (puVar4 == (uint8_t *)0xffffffffffffffff) {
      std::operator+(&local_f0,&this->_last_error,"mmap failed: ");
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      std::operator+(&local_d0,&local_f0,pcVar3);
      std::__cxx11::string::operator=((string *)&this->_last_error,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      this->_failed = true;
      bVar5 = false;
    }
  }
  this->_failed = bVar5;
  return;
}

Assistant:

void Elf_parser::load_memory_map()
{
    struct stat st;
    int fd;

    if ((fd = open(m_program_path.c_str(), O_RDWR)) < 0) {
       	_last_error = _last_error + "open failed: " + strerror(errno);
	_failed = true;
	return;
    }

    if (fstat(fd, &st) < 0) {
       	_last_error = _last_error + "stat failed: " + strerror(errno);
	_failed = true;
    }

    m_mmap_program = static_cast<uint8_t*>(mmap(NULL, st.st_size, PROT_READ | PROT_WRITE, MAP_PRIVATE, fd, 0));
    if (m_mmap_program == MAP_FAILED) {
       	_last_error = _last_error + "mmap failed: " + strerror(errno);
	_failed = true;
    }

    _failed = false;
}